

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O3

char * curl_easy_unescape(Curl_easy *data,char *string,int length,int *olen)

{
  CURLcode CVar1;
  int iVar2;
  char *str;
  size_t outputlen;
  char *local_18;
  ulong local_10;
  
  local_18 = (char *)0x0;
  if ((length < 0) ||
     (CVar1 = Curl_urldecode(string,(ulong)(uint)length,&local_18,&local_10,REJECT_NADA),
     CVar1 != CURLE_OK)) {
    local_18 = (char *)0x0;
  }
  else if (olen != (int *)0x0) {
    if (local_10 < 0x80000000) {
      iVar2 = curlx_uztosi(local_10);
      *olen = iVar2;
    }
    else {
      (*Curl_cfree)(local_18);
      local_18 = (char *)0x0;
    }
  }
  return local_18;
}

Assistant:

char *curl_easy_unescape(struct Curl_easy *data, const char *string,
                         int length, int *olen)
{
  char *str = NULL;
  (void)data;
  if(length >= 0) {
    size_t inputlen = (size_t)length;
    size_t outputlen;
    CURLcode res = Curl_urldecode(string, inputlen, &str, &outputlen,
                                  REJECT_NADA);
    if(res)
      return NULL;

    if(olen) {
      if(outputlen <= (size_t) INT_MAX)
        *olen = curlx_uztosi(outputlen);
      else
        /* too large to return in an int, fail! */
        Curl_safefree(str);
    }
  }
  return str;
}